

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall
ON_BinaryArchive::ReadV1_TCODE_MESH_OBJECT
          (ON_BinaryArchive *this,ON_Object **ppObject,ON_3dmObjectAttributes *pAttributes)

{
  undefined1 auVar1 [14];
  undefined1 auVar2 [14];
  bool bVar3;
  bool bVar4;
  ON_Mesh *this_00;
  ON_MeshFace *pOVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int face_count;
  int point_count;
  int boolHasTexCoordsAsInt;
  int boolHasVertexNormalsAsInt;
  char xyz_1 [3];
  ON_3dVector d;
  unsigned_short xyz [3];
  ON__UINT32 tcode;
  double local_80;
  ON_BoundingBox bbox;
  double local_48;
  double dStack_40;
  ON__INT64 big_value;
  
  tcode = 0;
  big_value = 0;
  bVar3 = BeginRead3dmBigChunk(this,&tcode,&big_value);
  if (!bVar3) {
    return false;
  }
  if (tcode != 0x100017) {
LAB_003d5853:
    bVar3 = false;
    this_00 = (ON_Mesh *)0x0;
    goto LAB_003d5859;
  }
  point_count = 0;
  face_count = 0;
  boolHasVertexNormalsAsInt = 0;
  boolHasTexCoordsAsInt = 0;
  ON_BoundingBox::ON_BoundingBox(&bbox);
  bVar4 = ReadInt(this,&point_count);
  this_00 = (ON_Mesh *)0x0;
  bVar3 = false;
  if ((!bVar4) || (bVar3 = false, point_count < 1)) goto LAB_003d5859;
  bVar4 = ReadInt(this,&face_count);
  bVar3 = false;
  this_00 = (ON_Mesh *)0x0;
  if ((!bVar4) || (this_00 = (ON_Mesh *)0x0, face_count < 1)) goto LAB_003d5859;
  bVar3 = ReadInt(this,&boolHasVertexNormalsAsInt);
  if ((((!bVar3) || (bVar3 = ReadInt(this,&boolHasTexCoordsAsInt), !bVar3)) ||
      (bVar3 = ReadPoint(this,&bbox.m_min), !bVar3)) ||
     (bVar3 = ReadPoint(this,&bbox.m_max), iVar7 = boolHasVertexNormalsAsInt,
     iVar8 = boolHasTexCoordsAsInt, !bVar3)) goto LAB_003d5853;
  bVar3 = boolHasVertexNormalsAsInt != 0;
  bVar4 = boolHasTexCoordsAsInt != 0;
  this_00 = (ON_Mesh *)operator_new(0x6e0);
  ON_Mesh::ON_Mesh(this_00,face_count,point_count,bVar3,bVar4);
  ON_BoundingBox::Diagonal(&d,&bbox);
  auVar9._4_4_ = d.x._4_4_;
  auVar9._0_4_ = d.x._0_4_;
  auVar9._8_4_ = d.y._0_4_;
  auVar9._12_4_ = d.y._4_4_;
  auVar9 = divpd(auVar9,_DAT_00694150);
  local_80 = d.z / 65535.0;
  iVar6 = 0;
  while ((iVar6 < point_count && (bVar3 = ReadInt16(this,3,(ON__INT16 *)xyz), bVar3))) {
    auVar10._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
    auVar10._4_2_ = SUB42(xyz._0_4_,2);
    auVar10._0_2_ = xyz[0];
    auVar10._2_2_ = xyz[1];
    local_48 = auVar9._0_8_;
    dStack_40 = auVar9._8_8_;
    _xyz_1 = (float)((double)(xyz._0_4_ & 0xffff) * local_48 +
                    (double)CONCAT71(bbox.m_min.x._1_7_,bbox.m_min.x._0_1_));
    register0x00001204 = (float)((double)auVar10._4_4_ * dStack_40 + bbox.m_min.y);
    ON_SimpleArray<ON_3fPoint>::Append
              (&(this_00->m_V).super_ON_SimpleArray<ON_3fPoint>,(ON_3fPoint *)xyz_1);
    iVar6 = iVar6 + 1;
  }
  if ((this_00->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count == point_count) {
    iVar6 = 0;
    if (point_count < 0xffff) {
      while ((iVar6 < face_count && (bVar3 = ReadInt16(this,4,(ON__INT16 *)&d), bVar3))) {
        pOVar5 = ON_SimpleArray<ON_MeshFace>::AppendNew(&this_00->m_F);
        auVar1._8_4_ = 0;
        auVar1._0_8_ = CONCAT44(d.x._4_4_,d.x._0_4_);
        auVar1._12_2_ = (short)((uint)d.x._4_4_ >> 0x10);
        auVar2._8_2_ = SUB42(d.x._4_4_,0);
        auVar2._0_8_ = CONCAT44(d.x._4_4_,d.x._0_4_);
        auVar2._10_4_ = auVar1._10_4_;
        auVar11._6_10_ = SUB1610(ZEXT616(auVar2._8_6_) << 0x40,6);
        auVar11._4_2_ = (short)((uint)d.x._0_4_ >> 0x10);
        auVar11._0_4_ = (uint)d.x._0_4_ & 0xffff;
        *(undefined1 (*) [16])pOVar5->vi = auVar11;
        iVar6 = iVar6 + 1;
      }
    }
    else {
      while ((iVar6 < face_count && (bVar3 = ReadInt32(this,4,(ON__INT32 *)&d), bVar3))) {
        pOVar5 = ON_SimpleArray<ON_MeshFace>::AppendNew(&this_00->m_F);
        pOVar5->vi[0] = (int)d.x._0_4_;
        pOVar5->vi[1] = (int)d.x._4_4_;
        pOVar5->vi[2] = (int)d.y._0_4_;
        pOVar5->vi[3] = d.y._4_4_;
        iVar6 = iVar6 + 1;
      }
    }
    if ((this_00->m_F).m_count == face_count) {
      if (iVar7 != 0) {
        iVar7 = 0;
        while ((iVar7 < point_count && (bVar3 = ReadByte(this,3,xyz_1), bVar3))) {
          auVar9 = ZEXT416(CONCAT22(CONCAT11(SUB81(_xyz_1,1),SUB81(_xyz_1,1)),
                                    CONCAT11((char)_xyz_1,(char)_xyz_1)));
          auVar9 = pshuflw(auVar9,auVar9,0x60);
          auVar12._0_8_ = (double)(auVar9._0_4_ >> 0x18);
          auVar12._8_8_ = (double)(auVar9._4_4_ >> 0x18);
          auVar9 = divpd(auVar12,_DAT_00694160);
          d.x._0_4_ = (float)auVar9._0_8_;
          d.x._4_4_ = (float)auVar9._8_8_;
          d.y._0_4_ = (float)(int)xyz_1[2] / 127.0;
          ON_SimpleArray<ON_3fVector>::Append
                    (&(this_00->m_N).super_ON_SimpleArray<ON_3fVector>,(ON_3fVector *)&d);
          iVar7 = iVar7 + 1;
        }
        if ((this_00->m_N).super_ON_SimpleArray<ON_3fVector>.m_count !=
            (this_00->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count) goto LAB_003d5a67;
      }
      if (iVar8 != 0) {
        iVar8 = 0;
        while ((iVar8 < point_count && (bVar3 = ReadInt16(this,2,(ON__INT16 *)xyz_1), bVar3))) {
          auVar13._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
          auVar13._4_2_ = SUB82(_xyz_1,2);
          auVar13._0_4_ = _xyz_1;
          auVar14._0_8_ = (double)((uint)_xyz_1 & 0xffff);
          auVar14._8_8_ = (double)auVar13._4_4_;
          auVar9 = divpd(auVar14,_DAT_00694150);
          d.x._0_4_ = (float)auVar9._0_8_;
          d.x._4_4_ = (float)auVar9._8_8_;
          ON_SimpleArray<ON_2fPoint>::Append
                    (&(this_00->m_T).super_ON_SimpleArray<ON_2fPoint>,(ON_2fPoint *)&d);
          iVar8 = iVar8 + 1;
        }
        if ((this_00->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count !=
            (this_00->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count) goto LAB_003d5a67;
      }
      bVar3 = true;
      goto LAB_003d5859;
    }
  }
LAB_003d5a67:
  bVar3 = false;
LAB_003d5859:
  bVar4 = EndRead3dmChunk(this);
  if (((this_00 != (ON_Mesh *)0x0) && (bVar3)) && (bVar4)) {
    *ppObject = (ON_Object *)this_00;
    bbox.m_min.x._0_1_ = 0;
    Read3dmV1AttributesOrMaterial
              (this,pAttributes,(ON_Material *)0x0,(bool *)&bbox,0xffffffff,(ON__3dmV1_XDATA *)0x0);
    return true;
  }
  if (this_00 != (ON_Mesh *)0x0) {
    (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(this_00);
  }
  return false;
}

Assistant:

bool ON_BinaryArchive::ReadV1_TCODE_MESH_OBJECT(
                                                ON_Object** ppObject,
                                                ON_3dmObjectAttributes* pAttributes
                                                )
{
  ON_Mesh* mesh = 0;
  bool rc = false;
  // read v1 mesh
  ON__UINT32 tcode = 0;
  ON__INT64 big_value = 0;
  int i;
  if ( !BeginRead3dmBigChunk(&tcode,&big_value) )
    return false;
  
  if ( tcode == TCODE_COMPRESSED_MESH_GEOMETRY ) for(;;) 
  {
    
    int point_count = 0;
    int face_count = 0;
    int boolHasVertexNormalsAsInt = false;
    int boolHasTexCoordsAsInt = false;
    ON_BoundingBox bbox;
    
    if (!ReadInt(&point_count) )
      break;
    if ( point_count <= 0 )
      break;
    if (!ReadInt(&face_count) )
      break;
    if ( face_count <= 0 )
      break;
    if (!ReadInt(&boolHasVertexNormalsAsInt) )
      break;
    if (!ReadInt(&boolHasTexCoordsAsInt) )
      break;
    if ( !ReadPoint(bbox.m_min) )
      break;
    if ( !ReadPoint(bbox.m_max) )
      break;

    const bool bHasVertexNormals = boolHasVertexNormalsAsInt ? true : false;
    const bool bHasTexCoords = boolHasTexCoordsAsInt ? true : false;

    mesh = new ON_Mesh(face_count,
                       point_count,
                       bHasVertexNormals,
                       bHasTexCoords
                       );

    // read 3d vertex locations
    {
      ON_3dVector d = bbox.Diagonal();
      double dx = d.x / 65535.0;
      double dy = d.y / 65535.0;
      double dz = d.z / 65535.0;
      unsigned short xyz[3];
      ON_3fPoint pt;
      for ( i = 0; i < point_count; i++ ) {
        if ( !ReadShort(3,xyz) )
          break;
        pt.x = (float)(dx*xyz[0] + bbox.m_min.x);
        pt.y = (float)(dy*xyz[1] + bbox.m_min.y);
        pt.z = (float)(dz*xyz[2] + bbox.m_min.z);
        mesh->m_V.Append(pt);
      }
    }
    if ( mesh->m_V.Count() != point_count )
      break;

    // read triangle/quadrangle faces
    if ( point_count < 65535 ) {
      unsigned short abcd[4];
      for ( i = 0; i < face_count; i++ ) {
        if ( !ReadShort(4,abcd) )
          break;
        ON_MeshFace& f = mesh->m_F.AppendNew();
        f.vi[0] = abcd[0];
        f.vi[1] = abcd[1];
        f.vi[2] = abcd[2];
        f.vi[3] = abcd[3];
      }
    }
    else {
      int abcd[4];
      for ( i = 0; i < face_count; i++ ) {
        if ( !ReadInt(4,abcd) )
          break;
        ON_MeshFace& f = mesh->m_F.AppendNew();
        f.vi[0] = abcd[0];
        f.vi[1] = abcd[1];
        f.vi[2] = abcd[2];
        f.vi[3] = abcd[3];
      }
    }
    if ( mesh->m_F.Count() != face_count )
      break;

    if ( bHasVertexNormals ) {
      char xyz[3];
      ON_3fVector normal;
      for ( i = 0; i < point_count; i++ ) {
        if ( !ReadChar(3,xyz) )
          break;
        normal.x = (float)(((signed char)xyz[0])/127.0);
        normal.y = (float)(((signed char)xyz[1])/127.0);
        normal.z = (float)(((signed char)xyz[2])/127.0);
        mesh->m_N.Append(normal);
      }
      if ( mesh->m_N.Count() != mesh->m_V.Count() )
        break;
    }

    if ( bHasTexCoords ) {
      unsigned short uv[2];
      ON_2fPoint t;
      for ( i = 0; i < point_count; i++ ) {
        if ( !ReadShort(2,uv) )
          break;
        t.x = (float)(uv[0]/65535.0);
        t.y = (float)(uv[1]/65535.0);
        mesh->m_T.Append(t);
      }
      if ( mesh->m_T.Count() != mesh->m_V.Count() )
        break;
    }

    rc = true;

    break;
  }
  
  if ( !EndRead3dmChunk() )
    rc = false;

  if ( rc && mesh ) {
    *ppObject = mesh;
  }
  else {
    if ( mesh )
      delete mesh;
    rc = false;
  }

  if ( rc && mesh ) {
    // attributes and material information follows the TCODE_COMPRESSED_MESH_GEOMETRY chunk;
    bool bHaveMat = false;
    Read3dmV1AttributesOrMaterial(pAttributes,nullptr,bHaveMat,TCODE_ENDOFTABLE);
  }

  return rc;
}